

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.hpp
# Opt level: O0

void __thiscall
jsoncons::not_an_object::not_an_object<char>(not_an_object *this,char *key,size_t length)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  json_exception::json_exception((json_exception *)&in_RDI[2].field_2._M_allocated_capacity);
  std::runtime_error::runtime_error
            ((runtime_error *)in_RDI,
             "Attempting to access a member of a value that is not an object");
  *(undefined8 *)in_RDI = 0x1334f08;
  in_RDI[2].field_2._M_allocated_capacity = 0x1334f40;
  std::__cxx11::string::string((string *)(in_RDI->field_2)._M_local_buf);
  std::__cxx11::string::string((string *)in_RDI[1].field_2._M_local_buf);
  unicode_traits::convert<char,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,in_RDI,(conv_flags)((ulong)in_stack_ffffffffffffffb8 >> 0x20)
            );
  return;
}

Assistant:

explicit not_an_object(const CharT* key, std::size_t length) noexcept
            : std::runtime_error("Attempting to access a member of a value that is not an object")
        {
            JSONCONS_TRY
            {
                unicode_traits::convert(key, length, name_,
                                 unicode_traits::conv_flags::strict);
            }